

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O3

db_bits * __thiscall lan::db::find_rec(db *this,string *address,db_bit_type type,db_bit *ref)

{
  pointer pcVar1;
  db_bit *pdVar2;
  db_bits *pdVar3;
  _Alloc_hider _Var4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string string;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  find__pop_address(&local_a8,(db *)address,address);
  if (address->_M_string_length == 0) {
    paVar5 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_48,local_a8._M_dataplus._M_p,
               local_a8._M_dataplus._M_p + local_a8._M_string_length);
    pdVar3 = find_any(this,&local_48,type,ref);
    _Var4._M_p = local_48._M_dataplus._M_p;
LAB_0010d592:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_Var4._M_p != paVar5) {
      operator_delete(_Var4._M_p,paVar5->_M_allocated_capacity + 1);
    }
  }
  else {
    if (local_a8._M_string_length != 0) {
      local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_88,local_a8._M_dataplus._M_p,
                 local_a8._M_dataplus._M_p + local_a8._M_string_length);
      pdVar2 = find_any(this,&local_88,type,ref);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_88._M_dataplus._M_p != &local_88.field_2) {
        operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
      }
      if (pdVar2 != (db_bit *)0x0) {
        paVar5 = &local_68.field_2;
        pcVar1 = (address->_M_dataplus)._M_p;
        local_68._M_dataplus._M_p = (pointer)paVar5;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar1,pcVar1 + address->_M_string_length);
        pdVar3 = find_rec(this,&local_68,type,pdVar2->lin);
        _Var4._M_p = local_68._M_dataplus._M_p;
        goto LAB_0010d592;
      }
    }
    pdVar3 = (db_bits *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
    operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
  }
  return pdVar3;
}

Assistant:

lan::db_bits * db::find_rec(std::string address, lan::db_bit_type const type, lan::db_bit * ref){
            std::string string = find__pop_address(address);
            if(address.empty()) {
                return find_any(string, type, ref);
            } else if(not string.empty()) {
                if((ref = find_any(string, type, ref))){
                    return find_rec(address, type, ref->lin);
                }
            } return nullptr;
        }